

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::ResolveTextureSubresource
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,ITexture *pSrcTexture,
          ITexture *pDstTexture,ResolveTextureSubresourceAttribs *ResolveAttribs)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ITexture *extraout_RDX;
  ITexture *pIVar5;
  char (*in_R9) [8];
  string msg;
  string local_68;
  String local_48;
  
  CVar2 = (this->m_Desc).QueueType;
  pIVar5 = pDstTexture;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_68,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ResolveTextureSubresource",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x77e);
      std::__cxx11::string::~string((string *)&local_68);
    }
    FormatString<char[97]>
              (&local_68,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x77e);
    std::__cxx11::string::~string((string *)&local_68);
    CVar2 = (this->m_Desc).QueueType;
    pIVar5 = extraout_RDX;
  }
  if ((~CVar2 & 7) != 0) {
    GetCommandQueueTypeString_abi_cxx11_
              (&local_48,(Diligent *)(ulong)CVar2,(COMMAND_QUEUE_TYPE)pIVar5);
    FormatString<char[26],char[22],std::__cxx11::string,char[8]>
              (&local_68,(Diligent *)"ResolveTextureSubresource",(char (*) [26])0x7e8bba,
               (char (*) [22])&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_48);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x77e);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassGLImpl *)0x0) {
    FormatString<char[71]>
              (&local_68,
               (char (*) [71])
               "ResolveTextureSubresource command must be used outside of render pass.");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x77f);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (pSrcTexture == (ITexture *)0x0 || pDstTexture == (ITexture *)0x0) {
    FormatString<char[38]>(&local_68,(char (*) [38])"Src and Dst textures must not be null");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"ResolveTextureSubresource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x781);
    std::__cxx11::string::~string((string *)&local_68);
  }
  iVar3 = (*(pSrcTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pSrcTexture);
  iVar4 = (*(pDstTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])(pDstTexture);
  VerifyResolveTextureSubresourceAttribs
            (ResolveAttribs,(TextureDesc *)CONCAT44(extraout_var,iVar3),
             (TextureDesc *)CONCAT44(extraout_var_00,iVar4));
  pUVar1 = &(this->m_Stats).CommandCounters.ResolveTextureSubresource;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::ResolveTextureSubresource(
    ITexture*                               pSrcTexture,
    ITexture*                               pDstTexture,
    const ResolveTextureSubresourceAttribs& ResolveAttribs)
{
#ifdef DILIGENT_DEVELOPMENT
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "ResolveTextureSubresource");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "ResolveTextureSubresource command must be used outside of render pass.");

    DEV_CHECK_ERR(pSrcTexture != nullptr && pDstTexture != nullptr, "Src and Dst textures must not be null");
    const TextureDesc& SrcTexDesc = pSrcTexture->GetDesc();
    const TextureDesc& DstTexDesc = pDstTexture->GetDesc();

    VerifyResolveTextureSubresourceAttribs(ResolveAttribs, SrcTexDesc, DstTexDesc);
#endif
    ++m_Stats.CommandCounters.ResolveTextureSubresource;
}